

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Cpu.cpp
# Opt level: O2

void __thiscall Sap_Cpu::reset(Sap_Cpu *this,void *new_mem)

{
  this->state = &this->state_;
  this->mem = (uint8_t *)new_mem;
  (this->r).sp = 0xff;
  (this->r).pc = 0;
  (this->r).a = '\0';
  (this->r).x = '\0';
  (this->r).y = '\0';
  (this->r).status = '\x04';
  (this->state_).base = 0;
  (this->state_).time = 0;
  this->irq_time_ = 0x40000000;
  this->end_time_ = 0x40000000;
  return;
}

Assistant:

void Sap_Cpu::reset( void* new_mem )
{
	check( state == &state_ );
	state = &state_;
	mem = (uint8_t*) new_mem;
	r.status = st_i;
	r.sp = 0xFF;
	r.pc = 0;
	r.a  = 0;
	r.x  = 0;
	r.y  = 0;
	state_.time = 0;
	state_.base = 0;
	irq_time_ = future_sap_time;
	end_time_ = future_sap_time;
	
	blargg_verify_byte_order();
}